

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::flip_y(dxt_image *this)

{
  undefined8 uVar1;
  uint block_y;
  uint uVar2;
  uint uVar3;
  element_type eVar4;
  element *peVar5;
  dxt_image *in_RDI;
  element tmp;
  uint e;
  uint x;
  uint h;
  uint y;
  uint mid_y;
  uint in_stack_ffffffffffffffd8;
  uint uVar6;
  uint element_index;
  uint block_x;
  uint local_18;
  dxt_image *this_00;
  bool local_1;
  
  if ((((in_RDI->m_format == cETC1) || (in_RDI->m_format == cETC2)) || (in_RDI->m_format == cETC2A))
     || ((in_RDI->m_format == cETC1S || (in_RDI->m_format == cETC2AS)))) {
    local_1 = false;
  }
  else if (((in_RDI->m_height & 3) == 0) || (in_RDI->m_height < 5)) {
    if (in_RDI->m_height == 1) {
      local_1 = true;
    }
    else {
      block_y = in_RDI->m_blocks_y >> 1;
      this_00 = in_RDI;
      for (local_18 = 0; local_18 < block_y; local_18 = local_18 + 1) {
        flip_row(this_00,block_y);
      }
      if ((in_RDI->m_blocks_y & 1) != 0) {
        uVar2 = math::minimum<unsigned_int>(in_RDI->m_height,4);
        for (block_x = 0; block_x < in_RDI->m_blocks_x; block_x = block_x + 1) {
          uVar6 = 0;
          while (element_index = uVar6, uVar3 = get_elements_per_block(in_RDI), uVar6 < uVar3) {
            peVar5 = get_element(in_RDI,block_x,block_y,element_index);
            uVar1 = *(undefined8 *)peVar5->m_bytes;
            eVar4 = get_element_type(in_RDI,element_index);
            if (eVar4 == cColorDXT1) {
              dxt1_block::flip_y((dxt1_block *)CONCAT44(uVar2,block_x),element_index,
                                 in_stack_ffffffffffffffd8);
            }
            else if (eVar4 == cAlphaDXT3) {
              dxt3_block::flip_y((dxt3_block *)CONCAT44(uVar2,block_x),element_index,
                                 in_stack_ffffffffffffffd8);
            }
            else if (eVar4 == cAlphaDXT5) {
              dxt5_block::flip_y((dxt5_block *)CONCAT44(uVar2,block_x),element_index,
                                 in_stack_ffffffffffffffd8);
            }
            peVar5 = get_element(in_RDI,block_x,block_y,element_index);
            *(undefined8 *)peVar5->m_bytes = uVar1;
            uVar6 = element_index + 1;
          }
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool dxt_image::flip_y() {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  if ((m_height & 3) && (m_height > 4))
    return false;

  if (m_height == 1)
    return true;

  const uint mid_y = m_blocks_y / 2;

  for (uint y = 0; y < mid_y; y++)
    flip_row(y);

  if (m_blocks_y & 1) {
    const uint h = math::minimum(m_height, 4U);
    for (uint x = 0; x < m_blocks_x; x++) {
      for (uint e = 0; e < get_elements_per_block(); e++) {
        element tmp(get_element(x, mid_y, e));
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp)->flip_y(4, h);
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp)->flip_y(4, h);
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp)->flip_y(4, h);
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
        get_element(x, mid_y, e) = tmp;
      }
    }
  }

  return true;
}